

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O1

void aom_hadamard_lp_8x8_dual_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  int16_t *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  short *psVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  
  lVar11 = 0;
  do {
    psVar1 = (short *)((long)src_diff + lVar11);
    lVar9 = src_stride * 4 + lVar11;
    psVar2 = (short *)((long)src_diff + src_stride * 2 + lVar11);
    psVar3 = (short *)((long)src_diff + src_stride * 4 + lVar11);
    psVar4 = (short *)((long)src_diff + src_stride * 2 + lVar9);
    lVar9 = src_stride * 4 + lVar9;
    psVar5 = (short *)((long)src_diff + src_stride * 8 + lVar11);
    lVar10 = src_stride * 2 + lVar9;
    psVar6 = (short *)((long)src_diff + src_stride * 2 + lVar9);
    psVar7 = (short *)((long)src_diff + src_stride * 2 + lVar10);
    psVar12 = (short *)((long)src_diff + src_stride * 4 + lVar10);
    sVar61 = *psVar2 + *psVar1;
    sVar62 = psVar2[1] + psVar1[1];
    sVar63 = psVar2[2] + psVar1[2];
    sVar64 = psVar2[3] + psVar1[3];
    sVar65 = psVar2[4] + psVar1[4];
    sVar66 = psVar2[5] + psVar1[5];
    sVar67 = psVar2[6] + psVar1[6];
    sVar68 = psVar2[7] + psVar1[7];
    sVar21 = *psVar1 - *psVar2;
    sVar22 = psVar1[1] - psVar2[1];
    sVar23 = psVar1[2] - psVar2[2];
    sVar24 = psVar1[3] - psVar2[3];
    sVar25 = psVar1[4] - psVar2[4];
    sVar26 = psVar1[5] - psVar2[5];
    sVar27 = psVar1[6] - psVar2[6];
    sVar28 = psVar1[7] - psVar2[7];
    sVar88 = *psVar4 + *psVar3;
    sVar90 = psVar4[1] + psVar3[1];
    sVar92 = psVar4[2] + psVar3[2];
    sVar94 = psVar4[3] + psVar3[3];
    sVar96 = psVar4[4] + psVar3[4];
    sVar98 = psVar4[5] + psVar3[5];
    sVar100 = psVar4[6] + psVar3[6];
    sVar102 = psVar4[7] + psVar3[7];
    sVar45 = *psVar3 - *psVar4;
    sVar46 = psVar3[1] - psVar4[1];
    sVar47 = psVar3[2] - psVar4[2];
    sVar48 = psVar3[3] - psVar4[3];
    sVar49 = psVar3[4] - psVar4[4];
    sVar50 = psVar3[5] - psVar4[5];
    sVar51 = psVar3[6] - psVar4[6];
    sVar52 = psVar3[7] - psVar4[7];
    sVar69 = *psVar6 + *psVar5;
    sVar70 = psVar6[1] + psVar5[1];
    sVar71 = psVar6[2] + psVar5[2];
    sVar72 = psVar6[3] + psVar5[3];
    sVar73 = psVar6[4] + psVar5[4];
    sVar74 = psVar6[5] + psVar5[5];
    sVar75 = psVar6[6] + psVar5[6];
    sVar76 = psVar6[7] + psVar5[7];
    sVar53 = *psVar5 - *psVar6;
    sVar54 = psVar5[1] - psVar6[1];
    sVar55 = psVar5[2] - psVar6[2];
    sVar56 = psVar5[3] - psVar6[3];
    sVar57 = psVar5[4] - psVar6[4];
    sVar58 = psVar5[5] - psVar6[5];
    sVar59 = psVar5[6] - psVar6[6];
    sVar60 = psVar5[7] - psVar6[7];
    sVar77 = *psVar12 + *psVar7;
    sVar78 = psVar12[1] + psVar7[1];
    sVar79 = psVar12[2] + psVar7[2];
    sVar80 = psVar12[3] + psVar7[3];
    sVar81 = psVar12[4] + psVar7[4];
    sVar82 = psVar12[5] + psVar7[5];
    sVar83 = psVar12[6] + psVar7[6];
    sVar84 = psVar12[7] + psVar7[7];
    sVar13 = *psVar7 - *psVar12;
    sVar14 = psVar7[1] - psVar12[1];
    sVar15 = psVar7[2] - psVar12[2];
    sVar16 = psVar7[3] - psVar12[3];
    sVar17 = psVar7[4] - psVar12[4];
    sVar18 = psVar7[5] - psVar12[5];
    sVar19 = psVar7[6] - psVar12[6];
    sVar20 = psVar7[7] - psVar12[7];
    sVar29 = sVar88 + sVar61;
    sVar30 = sVar90 + sVar62;
    sVar31 = sVar92 + sVar63;
    sVar32 = sVar94 + sVar64;
    sVar33 = sVar96 + sVar65;
    sVar34 = sVar98 + sVar66;
    sVar35 = sVar100 + sVar67;
    sVar36 = sVar102 + sVar68;
    sVar37 = sVar45 + sVar21;
    sVar38 = sVar46 + sVar22;
    sVar39 = sVar47 + sVar23;
    sVar40 = sVar48 + sVar24;
    sVar41 = sVar49 + sVar25;
    sVar42 = sVar50 + sVar26;
    sVar43 = sVar51 + sVar27;
    sVar44 = sVar52 + sVar28;
    sVar61 = sVar61 - sVar88;
    sVar62 = sVar62 - sVar90;
    sVar63 = sVar63 - sVar92;
    sVar64 = sVar64 - sVar94;
    sVar65 = sVar65 - sVar96;
    sVar66 = sVar66 - sVar98;
    sVar67 = sVar67 - sVar100;
    sVar68 = sVar68 - sVar102;
    sVar21 = sVar21 - sVar45;
    sVar22 = sVar22 - sVar46;
    sVar23 = sVar23 - sVar47;
    sVar24 = sVar24 - sVar48;
    sVar25 = sVar25 - sVar49;
    sVar26 = sVar26 - sVar50;
    sVar27 = sVar27 - sVar51;
    sVar28 = sVar28 - sVar52;
    sVar52 = sVar77 + sVar69;
    sVar88 = sVar78 + sVar70;
    sVar90 = sVar79 + sVar71;
    sVar92 = sVar80 + sVar72;
    sVar94 = sVar81 + sVar73;
    sVar96 = sVar82 + sVar74;
    sVar86 = sVar83 + sVar75;
    sVar87 = sVar84 + sVar76;
    sVar89 = sVar13 + sVar53;
    sVar91 = sVar14 + sVar54;
    sVar93 = sVar15 + sVar55;
    sVar95 = sVar16 + sVar56;
    sVar97 = sVar17 + sVar57;
    sVar99 = sVar18 + sVar58;
    sVar101 = sVar19 + sVar59;
    sVar103 = sVar20 + sVar60;
    sVar69 = sVar69 - sVar77;
    sVar70 = sVar70 - sVar78;
    sVar71 = sVar71 - sVar79;
    sVar72 = sVar72 - sVar80;
    sVar73 = sVar73 - sVar81;
    sVar74 = sVar74 - sVar82;
    sVar75 = sVar75 - sVar83;
    sVar76 = sVar76 - sVar84;
    sVar53 = sVar53 - sVar13;
    sVar54 = sVar54 - sVar14;
    sVar55 = sVar55 - sVar15;
    sVar56 = sVar56 - sVar16;
    sVar57 = sVar57 - sVar17;
    sVar58 = sVar58 - sVar18;
    sVar59 = sVar59 - sVar19;
    sVar60 = sVar60 - sVar20;
    sVar13 = sVar52 + sVar29;
    sVar14 = sVar88 + sVar30;
    sVar16 = sVar90 + sVar31;
    sVar15 = sVar92 + sVar32;
    sVar19 = sVar94 + sVar33;
    sVar17 = sVar96 + sVar34;
    sVar45 = sVar86 + sVar35;
    sVar18 = sVar87 + sVar36;
    sVar48 = sVar89 + sVar37;
    sVar82 = sVar91 + sVar38;
    sVar98 = sVar93 + sVar39;
    sVar83 = sVar95 + sVar40;
    sVar51 = sVar97 + sVar41;
    sVar84 = sVar99 + sVar42;
    sVar102 = sVar101 + sVar43;
    sVar85 = sVar103 + sVar44;
    sVar46 = sVar69 + sVar61;
    sVar104 = sVar70 + sVar62;
    sVar100 = sVar71 + sVar63;
    sVar105 = sVar72 + sVar64;
    sVar49 = sVar73 + sVar65;
    sVar106 = sVar74 + sVar66;
    sVar107 = sVar75 + sVar67;
    sVar108 = sVar76 + sVar68;
    sVar47 = sVar53 + sVar21;
    sVar20 = sVar54 + sVar22;
    sVar77 = sVar55 + sVar23;
    sVar78 = sVar56 + sVar24;
    sVar50 = sVar57 + sVar25;
    sVar79 = sVar58 + sVar26;
    sVar80 = sVar59 + sVar27;
    sVar81 = sVar60 + sVar28;
    sVar29 = sVar29 - sVar52;
    sVar30 = sVar30 - sVar88;
    sVar31 = sVar31 - sVar90;
    sVar32 = sVar32 - sVar92;
    sVar33 = sVar33 - sVar94;
    sVar34 = sVar34 - sVar96;
    sVar35 = sVar35 - sVar86;
    sVar36 = sVar36 - sVar87;
    sVar37 = sVar37 - sVar89;
    sVar38 = sVar38 - sVar91;
    sVar39 = sVar39 - sVar93;
    sVar40 = sVar40 - sVar95;
    sVar41 = sVar41 - sVar97;
    sVar42 = sVar42 - sVar99;
    sVar43 = sVar43 - sVar101;
    sVar44 = sVar44 - sVar103;
    sVar61 = sVar61 - sVar69;
    sVar62 = sVar62 - sVar70;
    sVar63 = sVar63 - sVar71;
    sVar64 = sVar64 - sVar72;
    sVar65 = sVar65 - sVar73;
    sVar66 = sVar66 - sVar74;
    sVar67 = sVar67 - sVar75;
    sVar68 = sVar68 - sVar76;
    sVar21 = sVar21 - sVar53;
    sVar22 = sVar22 - sVar54;
    sVar23 = sVar23 - sVar55;
    sVar24 = sVar24 - sVar56;
    sVar25 = sVar25 - sVar57;
    sVar26 = sVar26 - sVar58;
    sVar27 = sVar27 - sVar59;
    sVar28 = sVar28 - sVar60;
    sVar52 = sVar14 + sVar13;
    sVar53 = sVar62 + sVar61;
    sVar54 = sVar30 + sVar29;
    sVar55 = sVar104 + sVar46;
    sVar56 = sVar20 + sVar47;
    sVar57 = sVar22 + sVar21;
    sVar58 = sVar38 + sVar37;
    sVar59 = sVar82 + sVar48;
    sVar13 = sVar13 - sVar14;
    sVar61 = sVar61 - sVar62;
    sVar29 = sVar29 - sVar30;
    sVar46 = sVar46 - sVar104;
    sVar47 = sVar47 - sVar20;
    sVar21 = sVar21 - sVar22;
    sVar37 = sVar37 - sVar38;
    sVar48 = sVar48 - sVar82;
    sVar69 = sVar15 + sVar16;
    sVar70 = sVar64 + sVar63;
    sVar71 = sVar32 + sVar31;
    sVar72 = sVar105 + sVar100;
    sVar73 = sVar78 + sVar77;
    sVar74 = sVar24 + sVar23;
    sVar75 = sVar40 + sVar39;
    sVar76 = sVar83 + sVar98;
    sVar16 = sVar16 - sVar15;
    sVar63 = sVar63 - sVar64;
    sVar31 = sVar31 - sVar32;
    sVar100 = sVar100 - sVar105;
    sVar77 = sVar77 - sVar78;
    sVar23 = sVar23 - sVar24;
    sVar39 = sVar39 - sVar40;
    sVar98 = sVar98 - sVar83;
    sVar30 = sVar17 + sVar19;
    sVar32 = sVar66 + sVar65;
    sVar38 = sVar34 + sVar33;
    sVar40 = sVar106 + sVar49;
    sVar78 = sVar79 + sVar50;
    sVar60 = sVar26 + sVar25;
    sVar62 = sVar42 + sVar41;
    sVar64 = sVar84 + sVar51;
    sVar19 = sVar19 - sVar17;
    sVar65 = sVar65 - sVar66;
    sVar33 = sVar33 - sVar34;
    sVar49 = sVar49 - sVar106;
    sVar50 = sVar50 - sVar79;
    sVar25 = sVar25 - sVar26;
    sVar41 = sVar41 - sVar42;
    sVar51 = sVar51 - sVar84;
    sVar82 = sVar18 + sVar45;
    sVar83 = sVar68 + sVar67;
    sVar84 = sVar36 + sVar35;
    sVar88 = sVar108 + sVar107;
    sVar90 = sVar81 + sVar80;
    sVar92 = sVar28 + sVar27;
    sVar94 = sVar44 + sVar43;
    sVar96 = sVar85 + sVar102;
    sVar45 = sVar45 - sVar18;
    sVar67 = sVar67 - sVar68;
    sVar35 = sVar35 - sVar36;
    sVar107 = sVar107 - sVar108;
    sVar80 = sVar80 - sVar81;
    sVar27 = sVar27 - sVar28;
    sVar43 = sVar43 - sVar44;
    sVar102 = sVar102 - sVar85;
    sVar28 = sVar69 + sVar52;
    sVar34 = sVar70 + sVar53;
    sVar36 = sVar71 + sVar54;
    sVar42 = sVar72 + sVar55;
    sVar44 = sVar73 + sVar56;
    sVar79 = sVar74 + sVar57;
    sVar81 = sVar75 + sVar58;
    sVar66 = sVar76 + sVar59;
    sVar14 = sVar16 + sVar13;
    sVar15 = sVar63 + sVar61;
    sVar17 = sVar31 + sVar29;
    sVar18 = sVar100 + sVar46;
    sVar20 = sVar77 + sVar47;
    sVar22 = sVar23 + sVar21;
    sVar24 = sVar39 + sVar37;
    sVar26 = sVar98 + sVar48;
    sVar52 = sVar52 - sVar69;
    sVar53 = sVar53 - sVar70;
    sVar54 = sVar54 - sVar71;
    sVar55 = sVar55 - sVar72;
    sVar56 = sVar56 - sVar73;
    sVar57 = sVar57 - sVar74;
    sVar58 = sVar58 - sVar75;
    sVar59 = sVar59 - sVar76;
    sVar13 = sVar13 - sVar16;
    sVar61 = sVar61 - sVar63;
    sVar29 = sVar29 - sVar31;
    sVar46 = sVar46 - sVar100;
    sVar47 = sVar47 - sVar77;
    sVar21 = sVar21 - sVar23;
    sVar37 = sVar37 - sVar39;
    sVar48 = sVar48 - sVar98;
    sVar16 = sVar82 + sVar30;
    sVar23 = sVar83 + sVar32;
    sVar31 = sVar84 + sVar38;
    sVar39 = sVar88 + sVar40;
    sVar77 = sVar90 + sVar78;
    sVar69 = sVar92 + sVar60;
    sVar70 = sVar94 + sVar62;
    sVar63 = sVar96 + sVar64;
    sVar71 = sVar45 + sVar19;
    sVar72 = sVar67 + sVar65;
    sVar73 = sVar35 + sVar33;
    sVar74 = sVar107 + sVar49;
    sVar75 = sVar80 + sVar50;
    sVar68 = sVar27 + sVar25;
    sVar76 = sVar43 + sVar41;
    sVar98 = sVar102 + sVar51;
    sVar30 = sVar30 - sVar82;
    sVar32 = sVar32 - sVar83;
    sVar38 = sVar38 - sVar84;
    sVar40 = sVar40 - sVar88;
    sVar78 = sVar78 - sVar90;
    sVar60 = sVar60 - sVar92;
    sVar62 = sVar62 - sVar94;
    sVar64 = sVar64 - sVar96;
    sVar19 = sVar19 - sVar45;
    sVar65 = sVar65 - sVar67;
    sVar33 = sVar33 - sVar35;
    sVar49 = sVar49 - sVar107;
    sVar50 = sVar50 - sVar80;
    sVar25 = sVar25 - sVar27;
    sVar41 = sVar41 - sVar43;
    sVar51 = sVar51 - sVar102;
    piVar8 = coeff + lVar11 * 4;
    *piVar8 = sVar16 + sVar28;
    piVar8[1] = sVar23 + sVar34;
    piVar8[2] = sVar31 + sVar36;
    piVar8[3] = sVar39 + sVar42;
    piVar8[4] = sVar77 + sVar44;
    piVar8[5] = sVar69 + sVar79;
    piVar8[6] = sVar70 + sVar81;
    piVar8[7] = sVar63 + sVar66;
    piVar8 = coeff + lVar11 * 4 + 8;
    *piVar8 = sVar52 - sVar30;
    piVar8[1] = sVar53 - sVar32;
    piVar8[2] = sVar54 - sVar38;
    piVar8[3] = sVar55 - sVar40;
    piVar8[4] = sVar56 - sVar78;
    piVar8[5] = sVar57 - sVar60;
    piVar8[6] = sVar58 - sVar62;
    piVar8[7] = sVar59 - sVar64;
    piVar8 = coeff + lVar11 * 4 + 0x10;
    *piVar8 = sVar28 - sVar16;
    piVar8[1] = sVar34 - sVar23;
    piVar8[2] = sVar36 - sVar31;
    piVar8[3] = sVar42 - sVar39;
    piVar8[4] = sVar44 - sVar77;
    piVar8[5] = sVar79 - sVar69;
    piVar8[6] = sVar81 - sVar70;
    piVar8[7] = sVar66 - sVar63;
    piVar8 = coeff + lVar11 * 4 + 0x18;
    *piVar8 = sVar30 + sVar52;
    piVar8[1] = sVar32 + sVar53;
    piVar8[2] = sVar38 + sVar54;
    piVar8[3] = sVar40 + sVar55;
    piVar8[4] = sVar78 + sVar56;
    piVar8[5] = sVar60 + sVar57;
    piVar8[6] = sVar62 + sVar58;
    piVar8[7] = sVar64 + sVar59;
    piVar8 = coeff + lVar11 * 4 + 0x20;
    *piVar8 = sVar19 + sVar13;
    piVar8[1] = sVar65 + sVar61;
    piVar8[2] = sVar33 + sVar29;
    piVar8[3] = sVar49 + sVar46;
    piVar8[4] = sVar50 + sVar47;
    piVar8[5] = sVar25 + sVar21;
    piVar8[6] = sVar41 + sVar37;
    piVar8[7] = sVar51 + sVar48;
    piVar8 = coeff + lVar11 * 4 + 0x28;
    *piVar8 = sVar13 - sVar19;
    piVar8[1] = sVar61 - sVar65;
    piVar8[2] = sVar29 - sVar33;
    piVar8[3] = sVar46 - sVar49;
    piVar8[4] = sVar47 - sVar50;
    piVar8[5] = sVar21 - sVar25;
    piVar8[6] = sVar37 - sVar41;
    piVar8[7] = sVar48 - sVar51;
    piVar8 = coeff + lVar11 * 4 + 0x30;
    *piVar8 = sVar14 - sVar71;
    piVar8[1] = sVar15 - sVar72;
    piVar8[2] = sVar17 - sVar73;
    piVar8[3] = sVar18 - sVar74;
    piVar8[4] = sVar20 - sVar75;
    piVar8[5] = sVar22 - sVar68;
    piVar8[6] = sVar24 - sVar76;
    piVar8[7] = sVar26 - sVar98;
    piVar8 = coeff + lVar11 * 4 + 0x38;
    *piVar8 = sVar71 + sVar14;
    piVar8[1] = sVar72 + sVar15;
    piVar8[2] = sVar73 + sVar17;
    piVar8[3] = sVar74 + sVar18;
    piVar8[4] = sVar75 + sVar20;
    piVar8[5] = sVar68 + sVar22;
    piVar8[6] = sVar76 + sVar24;
    piVar8[7] = sVar98 + sVar26;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 == 0x10);
  return;
}

Assistant:

void aom_hadamard_lp_8x8_dual_sse2(const int16_t *src_diff,
                                   ptrdiff_t src_stride, int16_t *coeff) {
  for (int i = 0; i < 2; i++) {
    hadamard_lp_8x8_sse2(src_diff + (i * 8), src_stride, coeff + (i * 64));
  }
}